

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertEquals
          (UtestShell *this,bool failed,char *expected,char *actual,char *text,char *file,
          size_t line,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  byte in_SIL;
  long *in_RDI;
  SimpleString *in_R9;
  undefined8 in_stack_00000010;
  UtestShell *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff68;
  SimpleString *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  UtestShell *in_stack_ffffffffffffff88;
  CheckEqualFailure *in_stack_ffffffffffffff90;
  SimpleString *in_stack_ffffffffffffffa0;
  
  pTVar1 = getTestResult(in_stack_ffffffffffffff08);
  (*pTVar1->_vptr_TestResult[10])();
  if ((in_SIL & 1) != 0) {
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff08);
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff08);
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff08);
    CheckEqualFailure::CheckEqualFailure
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffffa0);
    (**(code **)(*in_RDI + 0x138))(in_RDI,&stack0xffffffffffffff68,in_stack_00000010);
    CheckEqualFailure::~CheckEqualFailure((CheckEqualFailure *)0x184222);
    SimpleString::~SimpleString((SimpleString *)0x18422c);
    SimpleString::~SimpleString((SimpleString *)0x184236);
    SimpleString::~SimpleString((SimpleString *)0x184240);
  }
  return;
}

Assistant:

void UtestShell::assertEquals(bool failed, const char* expected, const char* actual, const char* text, const char* file, size_t line, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (failed)
        failWith(CheckEqualFailure(this, file, line, expected, actual, text), testTerminator);
}